

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

void __thiscall Num::Num(Num *this,Short length,Byte dig)

{
  Byte dig_local;
  Short length_local;
  Num *this_local;
  
  std::__cxx11::string::string((string *)&this->base);
  this->size = length;
  std::__cxx11::string::append((ulong)&this->base,(char)length);
  return;
}

Assistant:

Num::Num(Num::Short length, Byte dig) // constructor that create a number of a given length consisting of a certain digit
{
    size = length;
    base.append(length, (char) dig + 48);
}